

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

vm_obj_id_t __thiscall vmtz_trans::get_as_list(vmtz_trans *this)

{
  vm_obj_id_t obj;
  vm_obj_id_t vVar1;
  vm_val_t *this_00;
  CVmObjList *in_RDI;
  vm_val_t ele;
  CVmObjList *lst;
  vm_obj_id_t lstid;
  size_t in_stack_ffffffffffffffc8;
  size_t idx;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  
  obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  this_00 = CVmStack::push();
  vm_val_t::set_obj(this_00,obj);
  vm_objp(0);
  CVmObjList::cons_clear(in_RDI);
  if ((*(int *)&(in_RDI->super_CVmObjCollection).super_CVmObject._vptr_CVmObject == -0x80000000) &&
     (*(int *)((long)&(in_RDI->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 4) ==
      -0x80000000)) {
    vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffffd8);
  }
  else {
    vVar1 = CVmObjDate::create((int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                               (int32_t)(in_stack_ffffffffffffffc8 >> 0x20));
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffd8,vVar1);
  }
  CVmObjList::cons_set_element(in_RDI,in_stack_ffffffffffffffc8,(vm_val_t *)0x2fcac9);
  vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffd8,
                    *(int32_t *)(in_RDI->super_CVmObjCollection).super_CVmObject.ext_);
  CVmObjList::cons_set_element(in_RDI,in_stack_ffffffffffffffc8,(vm_val_t *)0x2fcaf2);
  vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffd8,
                    *(int32_t *)((in_RDI->super_CVmObjCollection).super_CVmObject.ext_ + 4));
  CVmObjList::cons_set_element(in_RDI,in_stack_ffffffffffffffc8,(vm_val_t *)0x2fcb1c);
  idx = *(size_t *)((in_RDI->super_CVmObjCollection).super_CVmObject.ext_ + 8);
  strlen(*(char **)((in_RDI->super_CVmObjCollection).super_CVmObject.ext_ + 8));
  vVar1 = CVmObjString::create(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,(size_t)in_RDI);
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffd8,vVar1);
  CVmObjList::cons_set_element(in_RDI,idx,(vm_val_t *)0x2fcb68);
  CVmStack::discard(1);
  return obj;
}

Assistant:

vm_obj_id_t vmtz_trans::get_as_list(VMG0_) const
{
    /* create a result list for this item - [date, ofs, save, fmt] */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, 4);
    G_stk->push()->set_obj(lstid);

    /* get the list and clear it out, since we're building it in pieces */
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* 
     *   Element [1] is the transition time as a Date object, or nil if the
     *   date is INT32MINVALs (which represents the beginning of time, for
     *   the pre-establishment settings).
     */
    vm_val_t ele;
    if (dayno == INT32MINVAL && daytime == INT32MINVAL)
        ele.set_nil();
    else
        ele.set_obj(CVmObjDate::create(vmg_ FALSE, dayno, daytime));
    lst->cons_set_element(0, &ele);

    /* element [2] is the UTC offset */
    ele.set_int(ttype->gmtofs);
    lst->cons_set_element(1, &ele);
    
    /* element [3] is the daylight savings delta */
    ele.set_int(ttype->save);
    lst->cons_set_element(2, &ele);
    
    /* element [4] is the abbreviation string */
    ele.set_obj(CVmObjString::create(
        vmg_ FALSE, ttype->fmt, strlen(ttype->fmt)));
    lst->cons_set_element(3, &ele);

    /* discard gc protection and return the list object */
    G_stk->discard(1);
    return lstid;
}